

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O1

int ddCheckPermuation(DdManager *table,MtrNode *treenode,int *perm,int *invperm)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *invperm_00;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  
  iVar5 = 1;
  if (treenode != (MtrNode *)0x0) {
    invperm_00 = (int *)(ulong)(uint)table->size;
    uVar4 = treenode->low;
    uVar1 = treenode->size + uVar4;
    if (uVar4 < uVar1) {
      piVar7 = table->invperm + (int)uVar4;
      uVar6 = 0;
      do {
        uVar2 = perm[*piVar7];
        if ((int)uVar2 < (int)invperm_00) {
          invperm_00 = (int *)(ulong)uVar2;
        }
        if ((int)uVar6 < (int)uVar2) {
          uVar6 = uVar2;
        }
        piVar7 = piVar7 + 1;
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar1);
    }
    else {
      uVar6 = 0;
    }
    iVar5 = 0;
    if ((((uVar6 - (int)invperm_00) + 1 == treenode->size) &&
        ((iVar5 = 0, treenode->child == (MtrNode *)0x0 ||
         (iVar3 = ddCheckPermuation(table,treenode->child,perm,invperm_00), iVar3 != 0)))) &&
       ((treenode->younger == (MtrNode *)0x0 ||
        (iVar3 = ddCheckPermuation(table,treenode->younger,perm,invperm_00), iVar3 != 0)))) {
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

static int
ddCheckPermuation(
  DdManager * table,
  MtrNode * treenode,
  int * perm,
  int * invperm)
{
    int i, size;
    int index, level, minLevel, maxLevel;

    if (treenode == NULL) return(1);

    minLevel = table->size;
    maxLevel = 0;
    /* i : level */
    for (i = treenode->low; i < treenode->low + treenode->size; i++) {
        index = table->invperm[i];
        level = perm[index];
        if (level < minLevel)
            minLevel = level;
        if (level > maxLevel)
            maxLevel = level;
    }
    size = maxLevel - minLevel + 1;
    if (size != treenode->size)
        return(0);

    if (treenode->child != NULL) {
        if (!ddCheckPermuation(table, treenode->child, perm, invperm))
            return(0);
    }
    if (treenode->younger != NULL) {
        if (!ddCheckPermuation(table, treenode->younger, perm, invperm))
            return(0);
    }
    return(1);
}